

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterBase.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::ssc::SscWriterBase::SyncMpiPattern(SscWriterBase *this,MPI_Comm comm)

{
  int writerMasterStreamRank;
  int readerMasterStreamRank;
  MPI_Comm readerComm;
  MPI_Group writerGroup;
  MPI_Group streamGroup;
  
  helper::HandshakeComm
            (&this->m_Name,'w',this->m_OpenTimeoutSecs,comm,&streamGroup,&writerGroup,
             &this->m_ReaderGroup,&this->m_StreamComm,&this->m_WriterComm,&readerComm,
             this->m_Verbosity);
  MPI_Comm_rank(comm,&this->m_WriterRank);
  MPI_Comm_size(comm,&this->m_WriterSize);
  MPI_Comm_rank(this->m_StreamComm,&this->m_StreamRank);
  MPI_Comm_size(this->m_StreamComm,&this->m_StreamSize);
  writerMasterStreamRank = -1;
  if (this->m_WriterRank == 0) {
    writerMasterStreamRank = this->m_StreamRank;
  }
  MPI_Allreduce(&writerMasterStreamRank,&this->m_WriterMasterStreamRank,1,&ompi_mpi_int,
                &ompi_mpi_op_max,this->m_StreamComm);
  readerMasterStreamRank = -1;
  MPI_Allreduce(&readerMasterStreamRank,&this->m_ReaderMasterStreamRank,1,&ompi_mpi_int,
                &ompi_mpi_op_max,this->m_StreamComm);
  return;
}

Assistant:

void SscWriterBase::SyncMpiPattern(MPI_Comm comm)
{
    MPI_Group streamGroup;
    MPI_Group writerGroup;
    MPI_Comm readerComm;

    helper::HandshakeComm(m_Name, 'w', m_OpenTimeoutSecs, comm, streamGroup, writerGroup,
                          m_ReaderGroup, m_StreamComm, m_WriterComm, readerComm, m_Verbosity);

    MPI_Comm_rank(comm, &m_WriterRank);
    MPI_Comm_size(comm, &m_WriterSize);

    MPI_Comm_rank(m_StreamComm, &m_StreamRank);
    MPI_Comm_size(m_StreamComm, &m_StreamSize);

    int writerMasterStreamRank = -1;
    if (m_WriterRank == 0)
    {
        writerMasterStreamRank = m_StreamRank;
    }
    MPI_Allreduce(&writerMasterStreamRank, &m_WriterMasterStreamRank, 1, MPI_INT, MPI_MAX,
                  m_StreamComm);

    int readerMasterStreamRank = -1;
    MPI_Allreduce(&readerMasterStreamRank, &m_ReaderMasterStreamRank, 1, MPI_INT, MPI_MAX,
                  m_StreamComm);
}